

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_device.cpp
# Opt level: O0

void __thiscall embree::ISPCScene::ISPCScene(ISPCScene *this,RTCDevice device,TutorialScene *in)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  undefined8 uVar4;
  void *pvVar5;
  Ref<embree::SceneGraph::LightNode> *pRVar6;
  ISPCGeometry *pIVar7;
  size_type sVar8;
  undefined4 extraout_var;
  Light *pLVar9;
  long in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  Light *light;
  size_t i_2;
  size_t i_1;
  size_t i;
  Ref<embree::SceneGraph::Node> *in_stack_00000378;
  TutorialScene *in_stack_00000380;
  RTCDevice in_stack_00000388;
  size_t in_stack_fffffffffffffef8;
  size_t in_stack_ffffffffffffff00;
  Ref<embree::SceneGraph::LightNode> *in_00;
  long *local_98;
  Light *local_90;
  ulong local_88;
  ulong local_80;
  Node *local_68;
  Ref<embree::SceneGraph::LightNode> *local_60;
  long local_58;
  reference local_40;
  Node **local_38;
  Node **local_30;
  reference local_20;
  reference local_18;
  long **local_10;
  
  local_58 = in_RDX;
  uVar4 = rtcNewScene(in_RSI);
  *in_RDI = uVar4;
  in_RDI[6] = local_58;
  SceneGraph::opaque_geometry_destruction = deleteGeometry;
  std::
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  ::size((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
          *)(local_58 + 0x30));
  pvVar5 = alignedUSMMalloc(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,DEFAULT);
  in_RDI[1] = pvVar5;
  local_60 = (Ref<embree::SceneGraph::LightNode> *)0x0;
  while( true ) {
    in_00 = local_60;
    pRVar6 = (Ref<embree::SceneGraph::LightNode> *)
             std::
             vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
             ::size((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                     *)(local_58 + 0x30));
    if (pRVar6 <= in_00) break;
    local_40 = std::
               vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
               ::operator[]((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                             *)(local_58 + 0x30),(size_type)local_60);
    local_38 = &local_68;
    local_68 = local_40->ptr;
    if (local_68 != (Node *)0x0) {
      (*(local_68->super_RefCount)._vptr_RefCount[2])();
    }
    pIVar7 = convertGeometry(in_stack_00000388,in_stack_00000380,in_stack_00000378);
    *(ISPCGeometry **)(in_RDI[1] + (long)local_60 * 8) = pIVar7;
    local_30 = &local_68;
    if (local_68 != (Node *)0x0) {
      (*(local_68->super_RefCount)._vptr_RefCount[3])();
    }
    local_60 = (Ref<embree::SceneGraph::LightNode> *)((long)&local_60->ptr + 1);
  }
  sVar8 = std::
          vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
          ::size((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                  *)(local_58 + 0x30));
  *(int *)(in_RDI + 3) = (int)sVar8;
  std::
  vector<embree::Ref<embree::SceneGraph::MaterialNode>,_std::allocator<embree::Ref<embree::SceneGraph::MaterialNode>_>_>
  ::size((vector<embree::Ref<embree::SceneGraph::MaterialNode>,_std::allocator<embree::Ref<embree::SceneGraph::MaterialNode>_>_>
          *)(local_58 + 0x18));
  pvVar5 = alignedUSMMalloc(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,DEFAULT);
  in_RDI[2] = pvVar5;
  local_80 = 0;
  while( true ) {
    uVar2 = local_80;
    sVar8 = std::
            vector<embree::Ref<embree::SceneGraph::MaterialNode>,_std::allocator<embree::Ref<embree::SceneGraph::MaterialNode>_>_>
            ::size((vector<embree::Ref<embree::SceneGraph::MaterialNode>,_std::allocator<embree::Ref<embree::SceneGraph::MaterialNode>_>_>
                    *)(local_58 + 0x18));
    if (sVar8 <= uVar2) break;
    local_20 = std::
               vector<embree::Ref<embree::SceneGraph::MaterialNode>,_std::allocator<embree::Ref<embree::SceneGraph::MaterialNode>_>_>
               ::operator[]((vector<embree::Ref<embree::SceneGraph::MaterialNode>,_std::allocator<embree::Ref<embree::SceneGraph::MaterialNode>_>_>
                             *)(local_58 + 0x18),local_80);
    iVar3 = (*(local_20->ptr->super_Node).super_RefCount._vptr_RefCount[0xf])();
    *(ulong *)(in_RDI[2] + local_80 * 8) = CONCAT44(extraout_var,iVar3);
    local_80 = local_80 + 1;
  }
  sVar8 = std::
          vector<embree::Ref<embree::SceneGraph::MaterialNode>,_std::allocator<embree::Ref<embree::SceneGraph::MaterialNode>_>_>
          ::size((vector<embree::Ref<embree::SceneGraph::MaterialNode>,_std::allocator<embree::Ref<embree::SceneGraph::MaterialNode>_>_>
                  *)(local_58 + 0x18));
  *(int *)((long)in_RDI + 0x1c) = (int)sVar8;
  std::
  vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
  ::size((vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
          *)(local_58 + 0x48));
  pvVar5 = alignedUSMMalloc(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,DEFAULT);
  in_RDI[4] = pvVar5;
  *(undefined4 *)(in_RDI + 5) = 0;
  local_88 = 0;
  while( true ) {
    uVar2 = local_88;
    sVar8 = std::
            vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
            ::size((vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
                    *)(local_58 + 0x48));
    if (sVar8 <= uVar2) break;
    local_18 = std::
               vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
               ::operator[]((vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
                             *)(local_58 + 0x48),local_88);
    (*(local_18->ptr->super_Node).super_RefCount._vptr_RefCount[0x12])(0);
    pLVar9 = convertLight(in_00);
    local_10 = &local_98;
    if (local_98 != (long *)0x0) {
      (**(code **)(*local_98 + 0x18))();
    }
    if (pLVar9 != (Light *)0x0) {
      uVar1 = *(uint *)(in_RDI + 5);
      *(uint *)(in_RDI + 5) = uVar1 + 1;
      *(Light **)(in_RDI[4] + (ulong)uVar1 * 8) = pLVar9;
    }
    local_88 = local_88 + 1;
    local_90 = pLVar9;
  }
  return;
}

Assistant:

ISPCScene::ISPCScene(RTCDevice device, TutorialScene* in)
    : scene(rtcNewScene(device)), tutorialScene(in)
  {
    SceneGraph::opaque_geometry_destruction = (void(*)(void*)) deleteGeometry;

    geometries = (ISPCGeometry**) alignedUSMMalloc(sizeof(ISPCGeometry*)*in->geometries.size());

    for (size_t i=0; i<in->geometries.size(); i++)
      geometries[i] = convertGeometry(device,in,in->geometries[i]);
    numGeometries = unsigned(in->geometries.size());
    
    materials = (ISPCMaterial**) alignedUSMMalloc(sizeof(ISPCMaterial*)*in->materials.size());
    for (size_t i=0; i<in->materials.size(); i++)
      materials[i] = (ISPCMaterial*) in->materials[i]->material();
    numMaterials = unsigned(in->materials.size());
    
    lights = (Light**) alignedUSMMalloc(sizeof(Light*)*in->lights.size());
    numLights = 0;
    for (size_t i=0; i<in->lights.size(); i++)
    {
      Light* light = convertLight(in->lights[i]->get(0.0f));
      if (light) lights[numLights++] = light;
    }
  }